

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsortv.cpp
# Opt level: O0

void __thiscall CVmQSortVal::exchange(CVmQSortVal *this,size_t a,size_t b)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  vm_val_t val_b;
  vm_val_t val_a;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  (**(code **)(*in_RDI + 0x10))(in_RDI,in_RSI,local_28);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_18,local_38);
  (**(code **)(*in_RDI + 0x18))(in_RDI,local_18,local_28);
  (**(code **)(*in_RDI + 0x18))(in_RDI,local_10,local_38);
  return;
}

Assistant:

void CVmQSortVal::exchange(VMG_ size_t a, size_t b)
{
    vm_val_t val_a;
    vm_val_t val_b;

    /* get the two elements */
    get_ele(vmg_ a, &val_a);
    get_ele(vmg_ b, &val_b);

    /* store the two elements, swapping the positions */
    set_ele(vmg_ b, &val_a);
    set_ele(vmg_ a, &val_b);
}